

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

void QConcatenable<QStringBuilder<QStringBuilder<ProString_&,_QString_&>,_ProString_&>_>::
     appendTo<QChar>(type *p,QChar **out)

{
  ProString *pPVar1;
  QChar *pQVar2;
  QString *pQVar3;
  CutResult CVar4;
  char16_t *pcVar5;
  char16_t *pcVar6;
  long lVar7;
  long lVar8;
  long in_FS_OFFSET;
  long local_48;
  long local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pPVar1 = (p->a).a;
  lVar8 = (long)pPVar1->m_length;
  if (lVar8 != 0) {
    pQVar2 = *out;
    pcVar5 = (pPVar1->m_string).d.ptr;
    local_40 = (long)pPVar1->m_offset;
    local_48 = lVar8;
    CVar4 = QtPrivate::QContainerImplHelper::mid((pPVar1->m_string).d.size,&local_40,&local_48);
    pcVar6 = (char16_t *)0x0;
    if (CVar4 != Null) {
      pcVar6 = pcVar5 + local_40;
    }
    memcpy(pQVar2,pcVar6,lVar8 * 2);
    *out = *out + lVar8;
  }
  pQVar3 = (p->a).b;
  lVar8 = (pQVar3->d).size;
  if (lVar8 != 0) {
    pcVar5 = (pQVar3->d).ptr;
    if (pcVar5 == (char16_t *)0x0) {
      pcVar5 = (char16_t *)&QString::_empty;
    }
    memcpy(*out,pcVar5,lVar8 * 2);
  }
  pQVar2 = *out;
  *out = pQVar2 + lVar8;
  pPVar1 = p->b;
  lVar7 = (long)pPVar1->m_length;
  if (lVar7 != 0) {
    pcVar5 = (pPVar1->m_string).d.ptr;
    local_40 = (long)pPVar1->m_offset;
    local_48 = lVar7;
    CVar4 = QtPrivate::QContainerImplHelper::mid((pPVar1->m_string).d.size,&local_40,&local_48);
    pcVar6 = (char16_t *)0x0;
    if (CVar4 != Null) {
      pcVar6 = pcVar5 + local_40;
    }
    memcpy(pQVar2 + lVar8,pcVar6,lVar7 * 2);
    *out = *out + lVar7;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static inline void appendTo(const type &p, T *&out)
    {
        QConcatenableEx<A>::appendTo(p.a, out);
        QConcatenableEx<B>::appendTo(p.b, out);
    }